

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int x509_get_attr_type_value(uchar **p,uchar *end,mbedtls_x509_name *cur)

{
  byte *pbVar1;
  mbedtls_x509_name *pmVar2;
  mbedtls_x509_name *pmVar3;
  int iVar4;
  mbedtls_x509_buf *val;
  mbedtls_x509_buf *oid;
  size_t len;
  mbedtls_x509_name *pmStack_28;
  int ret;
  mbedtls_x509_name *cur_local;
  uchar *end_local;
  uchar **p_local;
  
  pmStack_28 = cur;
  cur_local = (mbedtls_x509_name *)end;
  end_local = (uchar *)p;
  len._4_4_ = mbedtls_asn1_get_tag(p,end,(size_t *)&oid,0x30);
  pmVar2 = pmStack_28;
  if (len._4_4_ == 0) {
    if ((long)cur_local - *(long *)end_local < 1) {
      p_local._4_4_ = -0x23e0;
    }
    else {
      (pmStack_28->oid).tag = (uint)**(byte **)end_local;
      len._4_4_ = mbedtls_asn1_get_tag
                            ((uchar **)end_local,(uchar *)cur_local,&(pmStack_28->oid).len,6);
      pmVar3 = pmStack_28;
      if (len._4_4_ == 0) {
        (pmVar2->oid).p = *(uchar **)end_local;
        *(size_t *)end_local = (pmVar2->oid).len + *(long *)end_local;
        if ((long)cur_local - *(long *)end_local < 1) {
          p_local._4_4_ = -0x23e0;
        }
        else if ((((**(char **)end_local == '\x1e') || (**(char **)end_local == '\f')) ||
                 (**(char **)end_local == '\x14')) ||
                (((**(char **)end_local == '\x13' || (**(char **)end_local == '\x16')) ||
                 ((**(char **)end_local == '\x1c' || (**(char **)end_local == '\x03')))))) {
          pbVar1 = *(byte **)end_local;
          *(byte **)end_local = pbVar1 + 1;
          (pmStack_28->val).tag = (uint)*pbVar1;
          iVar4 = mbedtls_asn1_get_len
                            ((uchar **)end_local,(uchar *)cur_local,&(pmStack_28->val).len);
          if (iVar4 == 0) {
            (pmVar3->val).p = *(uchar **)end_local;
            *(size_t *)end_local = (pmVar3->val).len + *(long *)end_local;
            pmStack_28->next = (mbedtls_asn1_named_data *)0x0;
            p_local._4_4_ = 0;
          }
          else {
            p_local._4_4_ = iVar4 + -0x2380;
          }
        }
        else {
          p_local._4_4_ = -0x23e2;
        }
      }
      else {
        p_local._4_4_ = len._4_4_ + -0x2380;
      }
    }
  }
  else {
    p_local._4_4_ = len._4_4_ + -0x2380;
  }
  return p_local._4_4_;
}

Assistant:

static int x509_get_attr_type_value( unsigned char **p,
                                     const unsigned char *end,
                                     mbedtls_x509_name *cur )
{
    int ret;
    size_t len;
    mbedtls_x509_buf *oid;
    mbedtls_x509_buf *val;

    if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
        return( MBEDTLS_ERR_X509_INVALID_NAME + ret );

    if( ( end - *p ) < 1 )
        return( MBEDTLS_ERR_X509_INVALID_NAME +
                MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    oid = &cur->oid;
    oid->tag = **p;

    if( ( ret = mbedtls_asn1_get_tag( p, end, &oid->len, MBEDTLS_ASN1_OID ) ) != 0 )
        return( MBEDTLS_ERR_X509_INVALID_NAME + ret );

    oid->p = *p;
    *p += oid->len;

    if( ( end - *p ) < 1 )
        return( MBEDTLS_ERR_X509_INVALID_NAME +
                MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    if( **p != MBEDTLS_ASN1_BMP_STRING && **p != MBEDTLS_ASN1_UTF8_STRING      &&
        **p != MBEDTLS_ASN1_T61_STRING && **p != MBEDTLS_ASN1_PRINTABLE_STRING &&
        **p != MBEDTLS_ASN1_IA5_STRING && **p != MBEDTLS_ASN1_UNIVERSAL_STRING &&
        **p != MBEDTLS_ASN1_BIT_STRING )
        return( MBEDTLS_ERR_X509_INVALID_NAME +
                MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );

    val = &cur->val;
    val->tag = *(*p)++;

    if( ( ret = mbedtls_asn1_get_len( p, end, &val->len ) ) != 0 )
        return( MBEDTLS_ERR_X509_INVALID_NAME + ret );

    val->p = *p;
    *p += val->len;

    cur->next = NULL;

    return( 0 );
}